

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas3_d.cpp
# Opt level: O2

void dtrmm(char side,char uplo,char transa,char diag,int m,int n,double alpha,double *a,int lda,
          double *b,int ldb)

{
  char ca;
  uint i2;
  char ca_00;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined7 in_register_00000009;
  long lVar5;
  double *pdVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined7 in_register_00000039;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  ulong uVar16;
  double dVar17;
  string local_90;
  undefined4 local_70;
  uint local_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  allocator<char> local_51;
  double local_50;
  bool local_48;
  undefined7 uStack_47;
  char local_39;
  uint local_38;
  char local_31;
  
  _local_68 = CONCAT44(uStack_64,(int)CONCAT71(in_register_00000011,transa));
  _local_60 = CONCAT44(uStack_5c,(int)CONCAT71(in_register_00000039,side));
  local_50 = alpha;
  bVar2 = lsame(side,'L');
  local_70 = (undefined4)CONCAT71(in_register_00000009,diag);
  local_31 = lsame(diag,'N');
  bVar3 = lsame(uplo,'U');
  _local_48 = CONCAT71(uStack_47,bVar3);
  local_6c = m;
  local_39 = bVar2;
  local_38 = n;
  if (!bVar2) {
    bVar2 = lsame((char)local_60,'R');
    m = n;
    if (!bVar2) {
      iVar4 = 1;
      goto LAB_0020f74f;
    }
  }
  if ((local_48 != false) || (bVar2 = lsame(uplo,'L'), bVar2)) {
    ca_00 = (char)local_68;
    bVar2 = lsame((char)local_68,'N');
    if ((bVar2) || ((bVar2 = lsame(ca_00,'T'), bVar2 || (bVar2 = lsame(ca_00,'C'), bVar2)))) {
      ca = (char)local_70;
      bVar2 = lsame((char)local_70,'U');
      if ((bVar2) || (bVar2 = lsame(ca,'N'), bVar2)) {
        uVar1 = local_38;
        i2 = local_6c;
        if ((int)local_6c < 0) {
          iVar4 = 5;
        }
        else if ((int)local_38 < 0) {
          iVar4 = 6;
        }
        else {
          iVar4 = i4_max(1,m);
          if (lda < iVar4) {
            iVar4 = 9;
          }
          else {
            iVar4 = i4_max(1,i2);
            if (iVar4 <= ldb) {
              if (uVar1 == 0) {
                return;
              }
              uVar16 = (ulong)i2;
              if ((local_50 == 0.0) && (!NAN(local_50))) {
                for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
                  for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                    b[uVar10] = 0.0;
                  }
                  b = b + ldb;
                }
                return;
              }
              iVar4 = lda + 1;
              uVar7 = (ulong)lda;
              if (local_39 != '\0') {
                bVar2 = lsame(ca_00,'N');
                if (!bVar2) {
                  lVar11 = (long)ldb;
                  if (local_48 != false) {
                    pdVar6 = b;
                    for (uVar10 = 0; uVar10 != local_38; uVar10 = uVar10 + 1) {
                      pdVar12 = a + (uVar16 - 1) * uVar7;
                      uVar13 = uVar16;
                      while (0 < (long)uVar13) {
                        uVar13 = uVar13 - 1;
                        dVar17 = b[uVar10 * lVar11 + uVar13];
                        if (local_31 != '\0') {
                          dVar17 = dVar17 * a[iVar4 * (int)uVar13];
                        }
                        for (lVar5 = 0; lVar5 < (long)uVar13; lVar5 = lVar5 + 1) {
                          dVar17 = dVar17 + pdVar12[lVar5] * pdVar6[lVar5];
                        }
                        b[uVar10 * lVar11 + uVar13] = dVar17 * local_50;
                        pdVar12 = pdVar12 + -uVar7;
                      }
                      pdVar6 = pdVar6 + lVar11;
                    }
                    return;
                  }
                  pdVar6 = b;
                  for (uVar10 = 0; uVar10 != local_38; uVar10 = uVar10 + 1) {
                    iVar8 = 1;
                    pdVar12 = a;
                    for (uVar13 = 0; uVar13 != uVar16; uVar13 = uVar13 + 1) {
                      dVar17 = b[uVar10 * lVar11 + uVar13];
                      if (local_31 != '\0') {
                        dVar17 = dVar17 * a[iVar4 * (int)uVar13];
                      }
                      for (lVar5 = (long)iVar8; lVar5 < (long)uVar16; lVar5 = lVar5 + 1) {
                        dVar17 = dVar17 + pdVar12[lVar5] * pdVar6[lVar5];
                      }
                      b[uVar10 * lVar11 + uVar13] = dVar17 * local_50;
                      iVar8 = iVar8 + 1;
                      pdVar12 = pdVar12 + uVar7;
                    }
                    pdVar6 = pdVar6 + lVar11;
                  }
                  return;
                }
                if (local_48 != false) {
                  pdVar6 = b;
                  for (uVar10 = 0; uVar10 != local_38; uVar10 = uVar10 + 1) {
                    lVar11 = uVar10 * (long)ldb;
                    pdVar12 = a;
                    for (uVar13 = 0; uVar13 != uVar16; uVar13 = uVar13 + 1) {
                      dVar17 = b[lVar11 + uVar13];
                      if ((dVar17 != 0.0) || (NAN(dVar17))) {
                        dVar17 = dVar17 * local_50;
                        for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
                          pdVar6[uVar14] = pdVar12[uVar14] * dVar17 + pdVar6[uVar14];
                        }
                        if (local_31 != '\0') {
                          dVar17 = dVar17 * a[iVar4 * (int)uVar13];
                        }
                        b[lVar11 + uVar13] = dVar17;
                      }
                      pdVar12 = pdVar12 + uVar7;
                    }
                    pdVar6 = pdVar6 + ldb;
                  }
                  return;
                }
                pdVar6 = b + uVar16;
                for (uVar10 = 0; uVar10 != local_38; uVar10 = uVar10 + 1) {
                  lVar11 = uVar10 * (long)ldb;
                  uVar13 = uVar16;
                  pdVar12 = pdVar6;
                  pdVar15 = a + (uVar16 - 1) * uVar7 + uVar16;
                  while (0 < (long)uVar13) {
                    uVar14 = uVar13 - 1;
                    dVar17 = b[lVar11 + uVar14];
                    if ((dVar17 != 0.0) || (NAN(dVar17))) {
                      dVar17 = dVar17 * local_50;
                      b[lVar11 + uVar14] = dVar17;
                      if (local_31 != '\0') {
                        b[lVar11 + uVar14] = a[iVar4 * (int)uVar14] * dVar17;
                      }
                      for (lVar5 = 0; (long)(uVar13 + lVar5) < (long)uVar16; lVar5 = lVar5 + 1) {
                        pdVar12[lVar5] = pdVar15[lVar5] * dVar17 + pdVar12[lVar5];
                      }
                    }
                    pdVar15 = pdVar15 + ~uVar7;
                    pdVar12 = pdVar12 + -1;
                    uVar13 = uVar14;
                  }
                  pdVar6 = pdVar6 + ldb;
                }
                return;
              }
              bVar2 = lsame(ca_00,'n');
              if (!bVar2) {
                if (local_48 != false) {
                  pdVar6 = b;
                  for (uVar10 = 0; uVar10 != local_38; uVar10 = uVar10 + 1) {
                    pdVar12 = b;
                    for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
                      dVar17 = a[uVar10 * uVar7 + uVar13];
                      if ((dVar17 != 0.0) || (NAN(dVar17))) {
                        for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
                          pdVar12[uVar14] = pdVar6[uVar14] * dVar17 * local_50 + pdVar12[uVar14];
                        }
                      }
                      pdVar12 = pdVar12 + ldb;
                    }
                    dVar17 = local_50;
                    if (local_31 != '\0') {
                      dVar17 = a[iVar4 * (int)uVar10] * local_50;
                    }
                    if ((dVar17 != 1.0) || (NAN(dVar17))) {
                      for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
                        pdVar6[uVar13] = pdVar6[uVar13] * dVar17;
                      }
                    }
                    pdVar6 = pdVar6 + ldb;
                  }
                  return;
                }
                uVar13 = (ulong)local_38;
                lVar11 = (long)ldb;
                pdVar6 = b + (uVar13 - 1) * lVar11;
                pdVar12 = b + lVar11 * uVar13;
                uVar10 = uVar13;
                while (0 < (long)uVar10) {
                  uVar14 = uVar10 - 1;
                  pdVar15 = pdVar12;
                  for (; (long)uVar10 < (long)uVar13; uVar10 = uVar10 + 1) {
                    dVar17 = a[uVar14 * uVar7 + uVar10];
                    if ((dVar17 != 0.0) || (NAN(dVar17))) {
                      for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
                        pdVar15[uVar9] = pdVar6[uVar9] * dVar17 * local_50 + pdVar15[uVar9];
                      }
                    }
                    pdVar15 = pdVar15 + lVar11;
                  }
                  dVar17 = local_50;
                  if (local_31 != '\0') {
                    dVar17 = a[iVar4 * (int)uVar14] * local_50;
                  }
                  if ((dVar17 != 1.0) || (NAN(dVar17))) {
                    for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                      pdVar6[uVar10] = pdVar6[uVar10] * dVar17;
                    }
                  }
                  pdVar6 = pdVar6 + -lVar11;
                  pdVar12 = pdVar12 + -lVar11;
                  uVar10 = uVar14;
                }
                return;
              }
              if (local_48 != false) {
                lVar11 = (long)ldb;
                uVar10 = (ulong)local_38;
                pdVar6 = b + (uVar10 - 1) * lVar11;
                while (0 < (long)uVar10) {
                  uVar10 = uVar10 - 1;
                  dVar17 = local_50;
                  if (local_31 != '\0') {
                    dVar17 = a[iVar4 * (int)uVar10] * local_50;
                  }
                  for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
                    pdVar6[uVar13] = pdVar6[uVar13] * dVar17;
                  }
                  pdVar12 = b;
                  for (lVar5 = 0; lVar5 < (long)uVar10; lVar5 = lVar5 + 1) {
                    dVar17 = a[uVar10 * uVar7 + lVar5];
                    if ((dVar17 != 0.0) || (NAN(dVar17))) {
                      for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
                        pdVar6[uVar13] = pdVar12[uVar13] * dVar17 * local_50 + pdVar6[uVar13];
                      }
                    }
                    pdVar12 = pdVar12 + lVar11;
                  }
                  pdVar6 = pdVar6 + -lVar11;
                }
                return;
              }
              lVar11 = (long)ldb;
              iVar8 = 1;
              pdVar6 = b;
              for (uVar10 = 0; uVar10 != local_38; uVar10 = uVar10 + 1) {
                dVar17 = local_50;
                if (local_31 != '\0') {
                  dVar17 = a[iVar4 * (int)uVar10] * local_50;
                }
                lVar5 = (long)iVar8;
                pdVar12 = (double *)(lVar11 * 8 * lVar5 + (long)b);
                for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
                  pdVar6[uVar13] = pdVar6[uVar13] * dVar17;
                }
                for (; lVar5 < (long)(ulong)local_38; lVar5 = lVar5 + 1) {
                  dVar17 = a[uVar10 * uVar7 + lVar5];
                  if ((dVar17 != 0.0) || (NAN(dVar17))) {
                    for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
                      pdVar6[uVar13] = pdVar12[uVar13] * dVar17 * local_50 + pdVar6[uVar13];
                    }
                  }
                  pdVar12 = pdVar12 + lVar11;
                }
                iVar8 = iVar8 + 1;
                pdVar6 = pdVar6 + lVar11;
              }
              return;
            }
            iVar4 = 0xb;
          }
        }
      }
      else {
        iVar4 = 4;
      }
    }
    else {
      iVar4 = 3;
    }
  }
  else {
    iVar4 = 2;
  }
LAB_0020f74f:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"DTRMM",&local_51);
  xerbla(&local_90,iVar4);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void dtrmm ( char side, char uplo, char transa, char diag, int m, int n, 
  double alpha, double a[], int lda, double b[], int ldb )

//****************************************************************************80
//
//  Purpose:
//
//    DTRMM performs B:=A*B or B:=B*A, A triangular, B rectangular.
//
//  Discussion:
//
//    This routine performs one of the matrix-matrix operations
//      B := alpha*op( A )*B,
//    or
//      B := alpha*B*op( A ),
//    where  alpha  is a scalar,  B  is an m by n matrix,  A  is a unit, or
//    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of
//      op( A ) = A   or   op( A ) = A'.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char SIDE, specifies whether op(A) multiplies B from
//    the left or right as follows:
//    'L' or 'l': B := alpha*op( A )*B.
//    'R' or 'r': B := alpha*B*op( A ).
//
//    Input, char UPLO, specifies whether the matrix A is an upper or
//    lower triangular matrix as follows:
//    'U' or 'u': A is an upper triangular matrix.
//    'L' or 'l': A is a lower triangular matrix.
//
//    Input, char TRANS, specifies the form of op( A ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n': op( A ) = A.
//    'T' or 't': op( A ) = A'.
//    'C' or 'c': op( A ) = A'.
//
//    Input, char DIAG, specifies whether or not A is unit triangular
//    as follows:
//    'U' or 'u': A is assumed to be unit triangular.
//    'N' or 'n': A is not assumed to be unit triangular.
//
//    Input, int M, the number of rows of B.  0 <= M.
//
//    Input, int N, the number of columns of B.  
//    0 <= N.
//
//    Input, double ALPHA, the scalar  alpha.  When alpha is
//    0.0, A is not referenced and B need not be set before entry.
//
//    Input, double A[LDA*K], where k is m when  SIDE = 'L' or 'l'  
//    and is  n  when  SIDE = 'R' or 'r'.
//    Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
//    upper triangular part of the array  A must contain the upper
//    triangular matrix  and the strictly lower triangular part of
//    A is not referenced.
//    Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
//    lower triangular part of the array  A must contain the lower
//    triangular matrix  and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'U' or 'u',  the diagonal elements of
//    A  are not referenced either,  but are assumed to be  unity.
//
//    Input, integer LDA, the first dimension of A as declared
//    in the calling program.  When SIDE = 'L' or 'l' then LDA must be at 
//    least max ( 1, M ); when SIDE = 'R' or 'r', LDA must be at least 
//    max ( 1, N ).
//
//    Input/output, double B[LDB*N].
//    Before entry, the leading m by n part of the array  B must contain 
//    the matrix  B, and on exit is overwritten by the transformed matrix.
//
//    Input, integer LDB, the first dimension of B as declared
//    in the calling program.   max ( 1, M ) <= LDB.
//
{
  int i;
  int info;
  int j;
  int k;
  int lside;
  int nounit;
  int nrowa;
  double temp;
  int upper;
//
//  Test the input parameters.
//
  lside = lsame ( side, 'L' );

  if ( lside )
  {
    nrowa = m;
  }
  else
  {
    nrowa = n;
  }

  nounit = lsame ( diag, 'N' );
  upper = lsame ( uplo, 'U' );

  info = 0;
  if ( ! lside && ! lsame ( side, 'R' ) )
  {
    info = 1;
  }
  else if ( ! upper && ! lsame ( uplo, 'L' ) )
  {
    info = 2;
  }
  else if ( ! lsame ( transa, 'N' ) && ! lsame ( transa, 'T' ) && 
            ! lsame ( transa, 'C' ) )
  {
    info = 3;
  }
  else if ( ! lsame ( diag, 'U' ) && ! lsame ( diag, 'N' ) )
  {
    info = 4;
  }
  else if ( m < 0 )
  {
    info = 5;
  }
  else if ( n < 0 )
  {
    info = 6;
  }
  else if ( lda < i4_max ( 1, nrowa ) )
  {
    info = 9;
  }
  else if ( ldb < i4_max ( 1, m ) )
  {
    info = 11;
  }

  if ( info != 0 ) 
  {
    xerbla ( "DTRMM", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 )
  {
    return;
  }
//
//  And when alpha is 0.0.
//
  if ( alpha == 0.0 )
  {
    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        b[i+j*ldb] = 0.0;
      }
    }
    return;
  }
//
//  Start the operations.
//
  if ( lside )
  {
//
//  Form  B := alpha*A*B.
//
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( k = 0; k < m; k++ )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              temp = alpha * b[k+j*ldb];
              for ( i = 0; i < k; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * a[i+k*lda];
              }
              if ( nounit )
              {
                temp = temp * a[k+k*lda];
              }
              b[k+j*ldb] = temp;
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( k = m - 1; 0 <= k; k-- )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              temp = alpha * b[k+j*ldb];
              b[k+j*ldb] = temp;
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] * a[k+k*lda];
              }
              for ( i = k + 1; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * a[i+k*lda];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*A'*B.
//
    else
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = m - 1; 0 <= i; i-- )
          {
            temp = b[i+j*ldb];
            if ( nounit )
            {
              temp = temp * a[i+i*lda];
            }
            for ( k = 0; k < i; k++ )
            {
              temp = temp + a[k+i*lda] * b[k+j*ldb];
            }
            b[i+j*ldb] = alpha * temp;
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = 0; i < m; i++ )
          {
            temp = b[i+j*ldb];
            if ( nounit )
            {
              temp = temp * a[i+i*lda];
            }
            for ( k = i + 1; k < m; k++ )
            {
              temp = temp + a[k+i*lda] * b[k+j*ldb];
            }
            b[i+j*ldb] = alpha * temp;
          }
        }
      }
    }
  }
//
//  Form  B := alpha*B*A.
//
  else
  {
    if ( lsame ( transa, 'n' ) )
    {
      if ( upper )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = 0; i < m; i++ )
          {
            b[i+j*ldb] = temp * b[i+j*ldb];
          }
          for ( k = 0; k < j; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              temp = alpha * a[k+j*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = 0; i < m; i++ )
          {
            b[i+j*ldb] = temp * b[i+j*ldb];
          }
          for ( k = j + 1; k < n; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              temp = alpha * a[k+j*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*B*A'.
//
    else
    {
      if ( upper )
      {
        for ( k = 0; k < n; k++ )
        {
          for ( j = 0; j < k; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = alpha * a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[k+k*lda];
          }
          if ( temp != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
        }
      }
      else
      {
        for ( k = n - 1; 0 <= k; k-- )
        {
          for ( j = k + 1; j < n; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = alpha * a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[k+k*lda];
          }
          if ( temp != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
        }
      }
    }
  }
  return;
}